

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<0>::operator()
          (_defaultInitializer<0> *this,ListBase *out,char *param_2)

{
  ListBase local_50;
  char *local_20;
  char *param_2_local;
  ListBase *out_local;
  _defaultInitializer<0> *this_local;
  
  local_20 = param_2;
  param_2_local = (char *)out;
  out_local = (ListBase *)this;
  memset(&local_50,0,0x30);
  ListBase::ListBase(&local_50);
  ListBase::operator=((ListBase *)param_2_local,&local_50);
  ListBase::~ListBase(&local_50);
  return;
}

Assistant:

void operator ()(T& out, const char* = NULL) {
            out = T();
        }